

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O2

bool __thiscall libDAI::HAK::initProps(HAK *this)

{
  Properties *this_00;
  bool bVar1;
  ClustersType CVar2;
  unsigned_long uVar3;
  double dVar4;
  allocator<char> local_39;
  PropertyKey local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"clusters",&local_39);
  this_00 = &(this->super_DAIAlgRG).super_InferenceAlgorithm._properties;
  bVar1 = Properties::hasKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tol",&local_39);
    bVar1 = Properties::hasKey(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"maxiter",&local_39);
      bVar1 = Properties::hasKey(this_00,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"verbose",&local_39);
        bVar1 = Properties::hasKey(this_00,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"doubleloop",&local_39);
          bVar1 = Properties::hasKey(this_00,&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"clusters",&local_39);
            CVar2 = Properties::FromStringTo<libDAI::HAK::ClustersType>(this_00,&local_38);
            (this->Props).clusters.v = CVar2.v;
            std::__cxx11::string::~string((string *)&local_38);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tol",&local_39);
            dVar4 = Properties::FromStringTo<double>(this_00,&local_38);
            (this->Props).tol = dVar4;
            std::__cxx11::string::~string((string *)&local_38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"maxiter",&local_39);
            uVar3 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
            (this->Props).maxiter = uVar3;
            std::__cxx11::string::~string((string *)&local_38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"verbose",&local_39);
            uVar3 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
            (this->Props).verbose = uVar3;
            std::__cxx11::string::~string((string *)&local_38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"damping",&local_39);
            bVar1 = Properties::hasKey(this_00,&local_38);
            std::__cxx11::string::~string((string *)&local_38);
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_38,"damping",&local_39);
              dVar4 = Properties::FromStringTo<double>(this_00,&local_38);
              (this->Props).damping = dVar4;
              std::__cxx11::string::~string((string *)&local_38);
            }
            else {
              (this->Props).damping = 0.0;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"doubleloop",&local_39);
            bVar1 = Properties::FromStringTo<bool>(this_00,&local_38);
            (this->Props).doubleloop = bVar1;
            std::__cxx11::string::~string((string *)&local_38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"loopdepth",&local_39);
            bVar1 = Properties::hasKey(this_00,&local_38);
            std::__cxx11::string::~string((string *)&local_38);
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_38,"loopdepth",&local_39);
              uVar3 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
              (this->Props).loopdepth = uVar3;
              std::__cxx11::string::~string((string *)&local_38);
            }
            else if ((this->Props).clusters.v == LOOP) {
              return false;
            }
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool HAK::initProps() {
        if( !HasProperty("clusters") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        if( !HasProperty("doubleloop") )
            return false;
        
        Props.clusters  = FromStringTo<ClustersType>("clusters");
        Props.tol       = FromStringTo<double>("tol");
        Props.maxiter   = FromStringTo<size_t>("maxiter");
        Props.verbose   = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            Props.damping = FromStringTo<double>("damping");
        else
            Props.damping = 0.0;
        Props.doubleloop = FromStringTo<bool>("doubleloop");

        if( HasProperty("loopdepth") )
            Props.loopdepth = FromStringTo<size_t>("loopdepth");
        else if( Props.clusters == ClustersType::LOOP )
            return false;

        return true;
    }